

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

char * luaL_optlstring(lua_State *L,int narg,char *def,size_t *len)

{
  int iVar1;
  size_t sVar2;
  size_t *in_RCX;
  lua_State *in_RDX;
  size_t *in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  iVar1 = lua_type(in_RDX,(int)((ulong)in_RCX >> 0x20));
  if (iVar1 < 1) {
    local_8 = in_RDX;
    if (in_RCX != (size_t *)0x0) {
      if (in_RDX == (lua_State *)0x0) {
        sVar2 = 0;
      }
      else {
        sVar2 = strlen((char *)in_RDX);
      }
      *in_RCX = sVar2;
      local_8 = in_RDX;
    }
  }
  else {
    local_8 = (lua_State *)
              luaL_checklstring(in_RDX,(int)((ulong)in_RCX >> 0x20),in_stack_ffffffffffffffd0);
  }
  return (char *)local_8;
}

Assistant:

static const char*luaL_optlstring(lua_State*L,int narg,
const char*def,size_t*len){
if(lua_isnoneornil(L,narg)){
if(len)
*len=(def?strlen(def):0);
return def;
}
else return luaL_checklstring(L,narg,len);
}